

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 CalcWindowAutoFitSize(ImGuiWindow *window,ImVec2 *size_contents)

{
  ImGuiContext *pIVar1;
  ImGuiPlatformMonitor *pIVar2;
  bool bVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  ImVec2 IVar7;
  float fStack_a4;
  bool will_have_scrollbar_y;
  float fStack_a0;
  bool will_have_scrollbar_x;
  ImVec2 size_auto_fit_after_constraint;
  ImVec2 local_94;
  ImVec2 local_8c;
  int local_84;
  ImVec2 IStack_80;
  int monitor_idx;
  ImVec2 local_78;
  ImVec2 avail_size;
  ImVec2 local_60;
  ImVec2 size_min;
  bool is_menu;
  bool is_popup;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImVec2 size_desired;
  ImVec2 size_pad;
  float decoration_up_height;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImVec2 *size_contents_local;
  ImGuiWindow *window_local;
  ImVec2 size_auto_fit;
  
  pIVar1 = GImGui;
  fVar5 = ImGuiWindow::TitleBarHeight(window);
  fVar6 = ImGuiWindow::MenuBarHeight(window);
  size_desired = operator*(&window->WindowPadding,2.0);
  local_4c = operator+(size_contents,&size_desired);
  ImVec2::ImVec2((ImVec2 *)&size_min.y,0.0,fVar5 + fVar6);
  local_44 = operator+(&local_4c,(ImVec2 *)&size_min.y);
  window_local = (ImGuiWindow *)local_44;
  if ((window->Flags & 0x2000000U) == 0) {
    size_min.x._3_1_ = (window->Flags & 0x4000000U) != 0;
    size_min.x._2_1_ = (window->Flags & 0x10000000U) != 0;
    local_60 = (pIVar1->Style).WindowMinSize;
    if (((bool)size_min.x._3_1_) || ((bool)size_min.x._2_1_)) {
      ImVec2::ImVec2(&avail_size,4.0,4.0);
      local_60 = ImMin(&local_60,&avail_size);
    }
    local_78 = (window->Viewport->super_ImGuiViewport).Size;
    if ((window->ViewportOwned & 1U) != 0) {
      ImVec2::ImVec2(&stack0xffffffffffffff80,3.4028235e+38,3.4028235e+38);
      local_78 = IStack_80;
    }
    local_84 = window->ViewportAllowPlatformMonitorExtend;
    if ((-1 < local_84) && (local_84 < (pIVar1->PlatformIO).Monitors.Size)) {
      pIVar2 = ImVector<ImGuiPlatformMonitor>::operator[](&(pIVar1->PlatformIO).Monitors,local_84);
      local_78 = pIVar2->WorkSize;
    }
    size_auto_fit_after_constraint = operator*(&(pIVar1->Style).DisplaySafeAreaPadding,2.0);
    local_94 = operator-(&local_78,&size_auto_fit_after_constraint);
    local_8c = ImMax(&local_60,&local_94);
    window_local = (ImGuiWindow *)ImClamp(&local_44,&local_60,local_8c);
    IVar7 = CalcWindowSizeAfterConstraint(window,(ImVec2 *)&window_local);
    fStack_a4 = IVar7.x;
    if (((size_contents->x <= (fStack_a4 - size_desired.x) - 0.0) || ((window->Flags & 8U) != 0)) ||
       (bVar3 = true, (window->Flags & 0x800U) == 0)) {
      bVar3 = (window->Flags & 0x8000U) != 0;
    }
    fStack_a0 = IVar7.y;
    if ((size_contents->y <= (fStack_a0 - size_desired.y) - (fVar5 + fVar6)) ||
       (bVar4 = true, (window->Flags & 8U) != 0)) {
      bVar4 = (window->Flags & 0x4000U) != 0;
    }
    if (bVar3) {
      window_local = (ImGuiWindow *)
                     CONCAT44((pIVar1->Style).ScrollbarSize + window_local._4_4_,window_local._0_4_)
      ;
    }
    if (bVar4) {
      window_local = (ImGuiWindow *)
                     CONCAT44(window_local._4_4_,(pIVar1->Style).ScrollbarSize + window_local._0_4_)
      ;
    }
  }
  return (ImVec2)window_local;
}

Assistant:

static ImVec2 CalcWindowAutoFitSize(ImGuiWindow* window, const ImVec2& size_contents)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    const float decoration_up_height = window->TitleBarHeight() + window->MenuBarHeight();
    ImVec2 size_pad = window->WindowPadding * 2.0f;
    ImVec2 size_desired = size_contents + size_pad + ImVec2(0.0f, decoration_up_height);
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Tooltip always resize
        return size_desired;
    }
    else
    {
        // Maximum window size is determined by the viewport size or monitor size
        const bool is_popup = (window->Flags & ImGuiWindowFlags_Popup) != 0;
        const bool is_menu = (window->Flags & ImGuiWindowFlags_ChildMenu) != 0;
        ImVec2 size_min = style.WindowMinSize;
        if (is_popup || is_menu) // Popups and menus bypass style.WindowMinSize by default, but we give then a non-zero minimum size to facilitate understanding problematic cases (e.g. empty popups)
            size_min = ImMin(size_min, ImVec2(4.0f, 4.0f));

        // FIXME-VIEWPORT-WORKAREA: May want to use GetWorkSize() instead of Size depending on the type of windows?
        ImVec2 avail_size = window->Viewport->Size;
        if (window->ViewportOwned)
            avail_size = ImVec2(FLT_MAX, FLT_MAX);
        const int monitor_idx = window->ViewportAllowPlatformMonitorExtend;
        if (monitor_idx >= 0 && monitor_idx < g.PlatformIO.Monitors.Size)
            avail_size = g.PlatformIO.Monitors[monitor_idx].WorkSize;
        ImVec2 size_auto_fit = ImClamp(size_desired, size_min, ImMax(size_min, avail_size - style.DisplaySafeAreaPadding * 2.0f));

        // When the window cannot fit all contents (either because of constraints, either because screen is too small),
        // we are growing the size on the other axis to compensate for expected scrollbar. FIXME: Might turn bigger than ViewportSize-WindowPadding.
        ImVec2 size_auto_fit_after_constraint = CalcWindowSizeAfterConstraint(window, size_auto_fit);
        bool will_have_scrollbar_x = (size_auto_fit_after_constraint.x - size_pad.x - 0.0f                 < size_contents.x && !(window->Flags & ImGuiWindowFlags_NoScrollbar) && (window->Flags & ImGuiWindowFlags_HorizontalScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysHorizontalScrollbar);
        bool will_have_scrollbar_y = (size_auto_fit_after_constraint.y - size_pad.y - decoration_up_height < size_contents.y && !(window->Flags & ImGuiWindowFlags_NoScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysVerticalScrollbar);
        if (will_have_scrollbar_x)
            size_auto_fit.y += style.ScrollbarSize;
        if (will_have_scrollbar_y)
            size_auto_fit.x += style.ScrollbarSize;
        return size_auto_fit;
    }
}